

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten.cpp
# Opt level: O0

void duckdb::ListFlattenFunction(DataChunk *args,ExpressionState *param_2,Vector *result)

{
  LogicalTypeId LVar1;
  bool bVar2;
  reference format;
  LogicalType *pLVar3;
  idx_t iVar4;
  list_entry_t *plVar5;
  Vector *other;
  DataChunk *in_RDI;
  idx_t in_stack_000000c8;
  Vector *result_child_vector;
  idx_t elem_idx;
  idx_t elem_raw_idx;
  list_entry_t *inner_entry_1;
  idx_t inner_idx_1;
  idx_t inner_raw_idx_1;
  list_entry_t list_entry;
  list_entry_t *outer_entry_1;
  idx_t outer_idx_2;
  idx_t outer_raw_idx_2;
  idx_t sel_idx;
  SelectionVector sel;
  list_entry_t *inner_entry;
  idx_t inner_idx;
  idx_t inner_raw_idx;
  list_entry_t *outer_entry;
  idx_t outer_idx_1;
  idx_t outer_raw_idx_1;
  list_entry_t *inner_data;
  list_entry_t *outer_data;
  idx_t total_items;
  idx_t items_count;
  Vector *items_vec;
  idx_t outer_idx;
  idx_t outer_raw_idx;
  idx_t inner_count;
  Vector *inner_vec;
  idx_t outer_count;
  value_type *outer_vec;
  UnifiedVectorFormat items_format;
  UnifiedVectorFormat inner_format;
  UnifiedVectorFormat outer_format;
  ValidityMask *flat_list_mask;
  list_entry_t *flat_list_data;
  Vector *in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffd28;
  Vector *in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3f;
  SelectionVector *in_stack_fffffffffffffd40;
  VectorType in_stack_fffffffffffffd4f;
  Vector *in_stack_fffffffffffffd50;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  Vector *in_stack_fffffffffffffd70;
  idx_t in_stack_fffffffffffffde8;
  Vector *in_stack_fffffffffffffdf0;
  ulong local_208;
  ulong local_1f0;
  list_entry_t local_1e8;
  list_entry_t *local_1d8;
  Vector *local_1d0;
  ulong local_1c8;
  uint64_t local_1c0;
  list_entry_t *local_1a0;
  idx_t local_198;
  ulong local_190;
  list_entry_t *local_188;
  idx_t local_180;
  ulong local_178;
  list_entry_t *local_170;
  list_entry_t *local_168;
  long local_160;
  idx_t local_158;
  Vector *local_150;
  idx_t local_148;
  ulong local_140;
  idx_t local_138;
  Vector *local_130;
  undefined4 local_124;
  idx_t local_120;
  reference local_118;
  SelectionVector *local_110;
  UnifiedVectorFormat local_b8;
  UnifiedVectorFormat local_70;
  ValidityMask *local_28;
  list_entry_t *local_20;
  DataChunk *local_8;
  
  local_8 = in_RDI;
  local_20 = FlatVector::GetData<duckdb::list_entry_t>((Vector *)0x201a95c);
  local_28 = FlatVector::Validity((Vector *)0x201a971);
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffd30);
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffd30);
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffd30);
  format = vector<duckdb::Vector,_true>::operator[]
                     ((vector<duckdb::Vector,_true> *)
                      CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                      (size_type)in_stack_fffffffffffffd18);
  local_118 = format;
  local_120 = DataChunk::size(local_8);
  Vector::ToUnifiedFormat
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(UnifiedVectorFormat *)format);
  pLVar3 = Vector::GetType(local_118);
  LVar1 = LogicalType::id(pLVar3);
  if (LVar1 == SQLNULL) {
    Vector::Reference(in_stack_fffffffffffffd70,
                      (Vector *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
    local_124 = 1;
  }
  else {
    local_130 = ListVector::GetEntry((Vector *)0x201aacc);
    local_138 = ListVector::GetListSize(in_stack_fffffffffffffd18);
    Vector::ToUnifiedFormat
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(UnifiedVectorFormat *)format);
    pLVar3 = Vector::GetType(local_130);
    LVar1 = LogicalType::id(pLVar3);
    if (LVar1 == SQLNULL) {
      for (local_140 = 0; local_140 < local_120; local_140 = local_140 + 1) {
        local_148 = SelectionVector::get_index(local_70.sel,local_140);
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_fffffffffffffd28,
                           CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
        if (bVar2) {
          local_20[local_140].offset = 0;
          local_20[local_140].length = 0;
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    ((TemplatedValidityMask<unsigned_long> *)
                     CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                     (idx_t)in_stack_fffffffffffffd18);
        }
      }
      bVar2 = DataChunk::AllConstant
                        ((DataChunk *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38))
      ;
      if (bVar2) {
        Vector::SetVectorType(in_stack_fffffffffffffd50,in_stack_fffffffffffffd4f);
      }
      local_124 = 1;
    }
    else {
      local_150 = ListVector::GetEntry((Vector *)0x201aca9);
      local_158 = ListVector::GetListSize(in_stack_fffffffffffffd18);
      Vector::ToUnifiedFormat
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(UnifiedVectorFormat *)format);
      local_160 = 0;
      local_168 = UnifiedVectorFormat::GetData<duckdb::list_entry_t>(&local_70);
      local_170 = UnifiedVectorFormat::GetData<duckdb::list_entry_t>(&local_b8);
      for (local_178 = 0; local_178 < local_120; local_178 = local_178 + 1) {
        local_180 = SelectionVector::get_index(local_70.sel,local_178);
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_fffffffffffffd28,
                           CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
        if (bVar2) {
          local_188 = local_168 + local_180;
          for (local_190 = local_188->offset; local_190 < local_188->offset + local_188->length;
              local_190 = local_190 + 1) {
            local_198 = SelectionVector::get_index(local_b8.sel,local_190);
            bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                              (in_stack_fffffffffffffd28,
                               CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
            if (bVar2) {
              local_1a0 = local_170 + local_198;
              local_160 = local_1a0->length + local_160;
            }
          }
        }
      }
      SelectionVector::SelectionVector
                (in_stack_fffffffffffffd40,
                 CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
      local_1c0 = 0;
      for (local_1c8 = 0; local_1c8 < local_120; local_1c8 = local_1c8 + 1) {
        in_stack_fffffffffffffd50 = (Vector *)SelectionVector::get_index(local_70.sel,local_1c8);
        local_1d0 = in_stack_fffffffffffffd50;
        in_stack_fffffffffffffd4f =
             TemplatedValidityMask<unsigned_long>::RowIsValid
                       (in_stack_fffffffffffffd28,
                        CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
        if ((bool)in_stack_fffffffffffffd4f) {
          local_1d8 = local_168 + (long)local_1d0;
          list_entry_t::list_entry_t(&local_1e8,local_1c0,0);
          for (local_1f0 = local_1d8->offset; local_1f0 < local_1d8->offset + local_1d8->length;
              local_1f0 = local_1f0 + 1) {
            iVar4 = SelectionVector::get_index(local_b8.sel,local_1f0);
            in_stack_fffffffffffffd3f =
                 TemplatedValidityMask<unsigned_long>::RowIsValid
                           (in_stack_fffffffffffffd28,
                            CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
            if ((bool)in_stack_fffffffffffffd3f) {
              plVar5 = local_170 + iVar4;
              local_1e8.length = plVar5->length + local_1e8.length;
              for (local_208 = plVar5->offset; local_208 < plVar5->offset + plVar5->length;
                  local_208 = local_208 + 1) {
                in_stack_fffffffffffffd30 =
                     (Vector *)SelectionVector::get_index(local_110,local_208);
                SelectionVector::set_index
                          ((SelectionVector *)in_stack_fffffffffffffd30,
                           (idx_t)in_stack_fffffffffffffd28,
                           CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
                local_1c0 = local_1c0 + 1;
              }
            }
          }
          local_20[local_1c8].offset = local_1e8.offset;
          local_20[local_1c8].length = local_1e8.length;
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    ((TemplatedValidityMask<unsigned_long> *)
                     CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                     (idx_t)in_stack_fffffffffffffd18);
        }
      }
      ListVector::SetListSize
                ((Vector *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                 (idx_t)in_stack_fffffffffffffd18);
      other = ListVector::GetEntry((Vector *)0x201b1e3);
      Vector::Slice(in_stack_fffffffffffffd30,other,
                    (SelectionVector *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20)
                    ,(idx_t)in_stack_fffffffffffffd18);
      Vector::Flatten(result_child_vector,in_stack_000000c8);
      in_stack_fffffffffffffd27 =
           DataChunk::AllConstant
                     ((DataChunk *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
      if ((bool)in_stack_fffffffffffffd27) {
        Vector::SetVectorType(in_stack_fffffffffffffd50,in_stack_fffffffffffffd4f);
      }
      SelectionVector::~SelectionVector((SelectionVector *)0x201b275);
      local_124 = 0;
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat
            ((UnifiedVectorFormat *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
  UnifiedVectorFormat::~UnifiedVectorFormat
            ((UnifiedVectorFormat *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
  UnifiedVectorFormat::~UnifiedVectorFormat
            ((UnifiedVectorFormat *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
  return;
}

Assistant:

static void ListFlattenFunction(DataChunk &args, ExpressionState &, Vector &result) {

	const auto flat_list_data = FlatVector::GetData<list_entry_t>(result);
	auto &flat_list_mask = FlatVector::Validity(result);

	UnifiedVectorFormat outer_format;
	UnifiedVectorFormat inner_format;
	UnifiedVectorFormat items_format;

	// Setup outer vec;
	auto &outer_vec = args.data[0];
	const auto outer_count = args.size();
	outer_vec.ToUnifiedFormat(outer_count, outer_format);

	// Special case: outer list is all-null
	if (outer_vec.GetType().id() == LogicalTypeId::SQLNULL) {
		result.Reference(outer_vec);
		return;
	}

	// Setup inner vec
	auto &inner_vec = ListVector::GetEntry(outer_vec);
	const auto inner_count = ListVector::GetListSize(outer_vec);
	inner_vec.ToUnifiedFormat(inner_count, inner_format);

	// Special case: inner list is all-null
	if (inner_vec.GetType().id() == LogicalTypeId::SQLNULL) {
		for (idx_t outer_raw_idx = 0; outer_raw_idx < outer_count; outer_raw_idx++) {
			const auto outer_idx = outer_format.sel->get_index(outer_raw_idx);
			if (!outer_format.validity.RowIsValid(outer_idx)) {
				flat_list_mask.SetInvalid(outer_raw_idx);
				continue;
			}
			flat_list_data[outer_raw_idx].offset = 0;
			flat_list_data[outer_raw_idx].length = 0;
		}
		if (args.AllConstant()) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
		}
		return;
	}

	// Setup items vec
	auto &items_vec = ListVector::GetEntry(inner_vec);
	const auto items_count = ListVector::GetListSize(inner_vec);
	items_vec.ToUnifiedFormat(items_count, items_format);

	// First pass: Figure out the total amount of items.
	// This can be more than items_count if the inner list reference the same item(s) multiple times.

	idx_t total_items = 0;

	const auto outer_data = UnifiedVectorFormat::GetData<list_entry_t>(outer_format);
	const auto inner_data = UnifiedVectorFormat::GetData<list_entry_t>(inner_format);

	for (idx_t outer_raw_idx = 0; outer_raw_idx < outer_count; outer_raw_idx++) {
		const auto outer_idx = outer_format.sel->get_index(outer_raw_idx);

		if (!outer_format.validity.RowIsValid(outer_idx)) {
			continue;
		}

		const auto &outer_entry = outer_data[outer_idx];

		for (idx_t inner_raw_idx = outer_entry.offset; inner_raw_idx < outer_entry.offset + outer_entry.length;
		     inner_raw_idx++) {
			const auto inner_idx = inner_format.sel->get_index(inner_raw_idx);

			if (!inner_format.validity.RowIsValid(inner_idx)) {
				continue;
			}

			const auto &inner_entry = inner_data[inner_idx];

			total_items += inner_entry.length;
		}
	}

	// Now we know the total amount of items, we can create our selection vector.
	SelectionVector sel(total_items);
	idx_t sel_idx = 0;

	// Second pass: Fill the selection vector (and the result list entries)

	for (idx_t outer_raw_idx = 0; outer_raw_idx < outer_count; outer_raw_idx++) {
		const auto outer_idx = outer_format.sel->get_index(outer_raw_idx);

		if (!outer_format.validity.RowIsValid(outer_idx)) {
			flat_list_mask.SetInvalid(outer_raw_idx);
			continue;
		}

		const auto &outer_entry = outer_data[outer_idx];

		list_entry_t list_entry = {sel_idx, 0};

		for (idx_t inner_raw_idx = outer_entry.offset; inner_raw_idx < outer_entry.offset + outer_entry.length;
		     inner_raw_idx++) {
			const auto inner_idx = inner_format.sel->get_index(inner_raw_idx);

			if (!inner_format.validity.RowIsValid(inner_idx)) {
				continue;
			}

			const auto &inner_entry = inner_data[inner_idx];

			list_entry.length += inner_entry.length;

			for (idx_t elem_raw_idx = inner_entry.offset; elem_raw_idx < inner_entry.offset + inner_entry.length;
			     elem_raw_idx++) {
				const auto elem_idx = items_format.sel->get_index(elem_raw_idx);

				sel.set_index(sel_idx, elem_idx);
				sel_idx++;
			}
		}

		// Assign the result list entry
		flat_list_data[outer_raw_idx] = list_entry;
	}

	// Now assing the result
	ListVector::SetListSize(result, sel_idx);

	auto &result_child_vector = ListVector::GetEntry(result);
	result_child_vector.Slice(items_vec, sel, sel_idx);
	result_child_vector.Flatten(sel_idx);

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}